

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint64_t farmhash_na_len_17_to_32(char *s,size_t len)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  long in_RSI;
  char *in_RDI;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t mul;
  
  uVar1 = in_RSI * 2 + 0x9ae16a3b2f90404f;
  uVar2 = fetch64(in_RDI);
  uVar3 = fetch64(in_RDI + 8);
  uVar4 = fetch64(in_RDI + in_RSI + -8);
  uVar4 = uVar4 * uVar1;
  uVar5 = fetch64(in_RDI + in_RSI + -0x10);
  uVar6 = ror64(uVar2 * -0x4b6d499041670d8d + uVar3,0x2b);
  uVar7 = ror64(uVar4,0x1e);
  uVar3 = ror64(uVar3 + 0x9ae16a3b2f90404f,0x12);
  uVar1 = farmhash_len_16_mul(uVar6 + uVar7 + uVar5 * -0x651e95c4d06fbfb1,
                              uVar2 * -0x4b6d499041670d8d + uVar3 + uVar4,uVar1);
  return uVar1;
}

Assistant:

static inline uint64_t farmhash_na_len_17_to_32(const char *s, size_t len) {
  uint64_t mul = k2 + len * 2;
  uint64_t a = fetch64(s) * k1;
  uint64_t b = fetch64(s + 8);
  uint64_t c = fetch64(s + len - 8) * mul;
  uint64_t d = fetch64(s + len - 16) * k2;
  return farmhash_len_16_mul(ror64(a + b, 43) + ror64(c, 30) + d,
                   a + ror64(b + k2, 18) + c, mul);
}